

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classifier.cpp
# Opt level: O3

void __thiscall GNB::GNB(GNB *this)

{
  long lVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  this->_vptr_GNB = (_func_int **)&PTR__GNB_00107d90;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"left","");
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"keep","");
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"right","");
  __l._M_len = 3;
  __l._M_array = &local_80;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->possible_labels,__l,&local_81);
  lVar1 = 0;
  do {
    if (local_30 + lVar1 != *(undefined1 **)((long)local_40 + lVar1)) {
      operator_delete(*(undefined1 **)((long)local_40 + lVar1));
    }
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x60);
  return;
}

Assistant:

GNB::GNB()
{
  /**
   * TODO: Initialize GNB, if necessary. May depend on your implementation.
   */
}